

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O3

XmlRpcValue __thiscall miniros::xmlrpc::responseInt(xmlrpc *this,int code,string *msg,int response)

{
  XmlRpcValue *pXVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  XmlRpcValue XVar2;
  int local_24;
  XmlRpcValue local_20;
  
  *(undefined4 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_24 = response;
  local_20._type = code;
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_20);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_20,msg);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_20);
  XmlRpc::XmlRpcValue::invalidate(&local_20);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_24);
  XVar2._value.asDouble = extraout_RDX.asDouble;
  XVar2._0_8_ = this;
  return XVar2;
}

Assistant:

XmlRpc::XmlRpcValue responseInt(int code, const std::string& msg, int response)
{
  XmlRpc::XmlRpcValue v;
  v[0] = int(code);
  v[1] = msg;
  v[2] = response;
  return v;
}